

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::LocationMaxAttributesTest::LocationMaxAttributesTest
          (LocationMaxAttributesTest *this,TestContext *testCtx,RenderContext *renderCtx,
          AttribType *type,int arraySize)

{
  char *name;
  char *description;
  int arraySize_00;
  string local_70;
  string local_50;
  uint local_2c;
  AttribType *pAStack_28;
  int arraySize_local;
  AttribType *type_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  LocationMaxAttributesTest *this_local;
  
  local_2c = arraySize;
  pAStack_28 = type;
  type_local = (AttribType *)renderCtx;
  renderCtx_local = (RenderContext *)testCtx;
  testCtx_local = (TestContext *)this;
  (anonymous_namespace)::generateTestName_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)type,(AttribType *)(ulong)(uint)arraySize,(int)type)
  ;
  arraySize_00 = (int)type;
  name = (char *)std::__cxx11::string::c_str();
  (anonymous_namespace)::generateTestName_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)pAStack_28,(AttribType *)(ulong)local_2c,
             arraySize_00);
  description = (char *)std::__cxx11::string::c_str();
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__LocationMaxAttributesTest_00cbbb88;
  this->m_renderCtx = (RenderContext *)type_local;
  AttributeLocationTestUtil::AttribType::AttribType(&this->m_type,pAStack_28);
  this->m_arraySize = local_2c;
  return;
}

Assistant:

LocationMaxAttributesTest::LocationMaxAttributesTest (tcu::TestContext&		testCtx,
													  glu::RenderContext&	renderCtx,
													  const AttribType&		type,
													  int					arraySize)
	: TestCase		(testCtx, generateTestName(type, arraySize).c_str(), generateTestName(type, arraySize).c_str())
	, m_renderCtx	(renderCtx)
	, m_type		(type)
	, m_arraySize	(arraySize)
{
}